

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O0

bool kj::_::expectFatalThrow
               (Maybe<kj::Exception::Type> *type,Maybe<kj::StringPtr> *message,
               Function<void_()> *code)

{
  int iVar1;
  void *pvVar2;
  NullableValue<kj::Exception> *other;
  Exception *pEVar3;
  anon_class_8_1_898a5aeb *func;
  bool local_411;
  uint local_410;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  Fault f_1;
  SyscallResult local_3ec;
  uint local_3e8;
  SyscallResult _kjSyscallResult_1;
  int status;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  Exception *e;
  Maybe<kj::Exception> local_3d0;
  undefined1 local_238 [8];
  NullableValue<kj::Exception> _e110;
  Maybe<kj::Exception::Type> local_88;
  undefined1 local_80 [8];
  FatalThrowExpectation expectation;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_test_helpers_c__:106:5)>
  _kjDefer106;
  Fault local_40;
  Fault f;
  SyscallResult local_30;
  undefined1 local_2c [4];
  SyscallResult _kjSyscallResult;
  pid_t child;
  Function<void_()> *code_local;
  Maybe<kj::StringPtr> *message_local;
  Maybe<kj::Exception::Type> *type_local;
  
  f.exception = (Exception *)local_2c;
  __kjSyscallResult = code;
  local_30 = Debug::
             syscall<kj::_::expectFatalThrow(kj::Maybe<kj::Exception::Type>,kj::Maybe<kj::StringPtr>,kj::Function<void()>)::__0>
                       ((anon_class_8_1_a7bde43c *)&f,false);
  pvVar2 = Debug::SyscallResult::operator_cast_to_void_(&local_30);
  if (pvVar2 == (void *)0x0) {
    iVar1 = Debug::SyscallResult::getErrorNumber(&local_30);
    Debug::Fault::Fault(&local_40,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                        ,0x68,iVar1,"child = fork()","");
    Debug::Fault::fatal(&local_40);
  }
  if (local_2c == (undefined1  [4])0x0) {
    defer<kj::_::expectFatalThrow(kj::Maybe<kj::Exception::Type>,kj::Maybe<kj::StringPtr>,kj::Function<void()>)::__1>
              ((kj *)((long)&expectation.message.ptr.field_1.value.content.size_ + 2),
               (Type *)((long)&expectation.message.ptr.field_1.value.content.size_ + 1));
    Maybe<kj::Exception::Type>::Maybe(&local_88,type);
    Maybe<kj::StringPtr>::Maybe
              ((Maybe<kj::StringPtr> *)&_e110.field_1.value.details.builder.disposer,message);
    anon_unknown_16::FatalThrowExpectation::FatalThrowExpectation
              ((FatalThrowExpectation *)local_80,&local_88,
               (Maybe<kj::StringPtr> *)&_e110.field_1.value.details.builder.disposer);
    Maybe<kj::StringPtr>::~Maybe
              ((Maybe<kj::StringPtr> *)&_e110.field_1.value.details.builder.disposer);
    Maybe<kj::Exception::Type>::~Maybe(&local_88);
    e = (Exception *)code;
    runCatchingExceptions<kj::_::expectFatalThrow(kj::Maybe<kj::Exception::Type>,kj::Maybe<kj::StringPtr>,kj::Function<void()>)::__2>
              (&local_3d0,(kj *)&e,func);
    other = readMaybe<kj::Exception>(&local_3d0);
    NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_238,other);
    Maybe<kj::Exception>::~Maybe(&local_3d0);
    pEVar3 = NullableValue::operator_cast_to_Exception_((NullableValue *)local_238);
    if (pEVar3 == (Exception *)0x0) {
      _kjSyscallResult_1.errorNumber._2_1_ = Debug::shouldLog(ERROR);
      while ((bool)_kjSyscallResult_1.errorNumber._2_1_ != false) {
        Debug::log<char_const(&)[30]>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                   ,0x71,ERROR,"\"no fatal exception was thrown\"",
                   (char (*) [30])"no fatal exception was thrown");
        _kjSyscallResult_1.errorNumber._2_1_ = false;
      }
    }
    else {
      pEVar3 = NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_238);
      _kjSyscallResult_1.errorNumber._3_1_ = Debug::shouldLog(ERROR);
      while ((bool)_kjSyscallResult_1.errorNumber._3_1_ != false) {
        Debug::log<char_const(&)[56],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                   ,0x6f,ERROR,"\"a non-fatal exception was thrown, but we expected fatal\", e",
                   (char (*) [56])"a non-fatal exception was thrown, but we expected fatal",pEVar3);
        _kjSyscallResult_1.errorNumber._3_1_ = false;
      }
    }
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_238);
    anon_unknown_16::FatalThrowExpectation::~FatalThrowExpectation
              ((FatalThrowExpectation *)local_80);
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++:106:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_test_helpers_c__:106:5)>
                 *)((long)&expectation.message.ptr.field_1.value.content.size_ + 2));
  }
  f_1.exception = (Exception *)local_2c;
  local_3ec = Debug::
              syscall<kj::_::expectFatalThrow(kj::Maybe<kj::Exception::Type>,kj::Maybe<kj::StringPtr>,kj::Function<void()>)::__3>
                        ((anon_class_16_2_faf9cb4d *)&f_1,false);
  pvVar2 = Debug::SyscallResult::operator_cast_to_void_(&local_3ec);
  if (pvVar2 == (void *)0x0) {
    iVar1 = Debug::SyscallResult::getErrorNumber(&local_3ec);
    Debug::Fault::Fault((Fault *)&stack0xfffffffffffffbf8,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                        ,0x76,iVar1,"waitpid(child, &status, 0)","");
    Debug::Fault::fatal((Fault *)&stack0xfffffffffffffbf8);
  }
  if ((local_3e8 & 0x7f) == 0) {
    type_local._7_1_ = (int)(local_3e8 & 0xff00) >> 8 == 0;
  }
  else if ((char)(((byte)local_3e8 & 0x7f) + 1) >> 1 < '\x01') {
    local_411 = Debug::shouldLog(ERROR);
    while (local_411 != false) {
      Debug::log<char_const(&)[39],int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                 ,0x7e,ERROR,"\"subprocess neither exited nor crashed?\", status",
                 (char (*) [39])"subprocess neither exited nor crashed?",(int *)&local_3e8);
      local_411 = false;
    }
    type_local._7_1_ = false;
  }
  else {
    _kj_shouldLog_3 = Debug::shouldLog(ERROR);
    while (_kj_shouldLog_3 != false) {
      local_410 = local_3e8 & 0x7f;
      Debug::log<char_const(&)[46],int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                 ,0x7b,ERROR,"\"subprocess crashed without throwing exception\", WTERMSIG(status)",
                 (char (*) [46])"subprocess crashed without throwing exception",(int *)&local_410);
      _kj_shouldLog_3 = false;
    }
    type_local._7_1_ = false;
  }
  return type_local._7_1_;
}

Assistant:

bool expectFatalThrow(kj::Maybe<Exception::Type> type, kj::Maybe<StringPtr> message,
                      Function<void()> code) {
#if _WIN32
  // We don't support death tests on Windows due to lack of efficient fork.
  return true;
#else
  pid_t child;
  KJ_SYSCALL(child = fork());
  if (child == 0) {
    KJ_DEFER(_exit(1));
    FatalThrowExpectation expectation(type, message);
    KJ_IF_SOME(e, kj::runCatchingExceptions([&]() {
      code();
    })) {
      KJ_LOG(ERROR, "a non-fatal exception was thrown, but we expected fatal", e);
    } else {
      KJ_LOG(ERROR, "no fatal exception was thrown");
    }
  }

  int status;
  KJ_SYSCALL(waitpid(child, &status, 0));

  if (WIFEXITED(status)) {
    return WEXITSTATUS(status) == 0;
  } else if (WIFSIGNALED(status)) {
    KJ_FAIL_EXPECT("subprocess crashed without throwing exception", WTERMSIG(status));
    return false;
  } else {
    KJ_FAIL_EXPECT("subprocess neither exited nor crashed?", status);
    return false;
  }
#endif
}